

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableRemove(ImGuiTable *table)

{
  ImGuiTable *pIVar1;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  pIVar1 = (GImGui->Tables).Buf.Data;
  ImPool<ImGuiTable>::Remove(&GImGui->Tables,table->ID,table);
  (pIVar2->TablesLastTimeActive).Data[(int)(((long)table - (long)pIVar1) / 600)] = -1.0;
  return;
}

Assistant:

void ImGui::TableRemove(ImGuiTable* table)
{
    //IMGUI_DEBUG_LOG("TableRemove() id=0x%08X\n", table->ID);
    ImGuiContext& g = *GImGui;
    int table_idx = g.Tables.GetIndex(table);
    //memset(table->RawData.Data, 0, table->RawData.size_in_bytes());
    //memset(table, 0, sizeof(ImGuiTable));
    g.Tables.Remove(table->ID, table);
    g.TablesLastTimeActive[table_idx] = -1.0f;
}